

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O2

void PushExpression(s_assenv *ae,int iw,e_expression zetype)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  s_wordlist *psVar7;
  int in_R9D;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  s_wordlist local_48;
  e_expression local_30;
  int local_2c;
  int local_28;
  int local_24;
  
  local_48.e = 0;
  local_48.ifile = 0;
  local_48.w = (char *)0x0;
  local_48.l = 0;
  local_48.t = 0;
  if (ae->nocode != 0) {
    iVar2 = ae->outputadr;
    if (zetype < (E_EXPRESSION_IM|E_EXPRESSION_0V8)) {
      iVar4 = *(int *)(&DAT_00137018 + (ulong)zetype * 4);
      iVar2 = iVar2 + iVar4;
      ae->outputadr = iVar2;
      ae->codeadr = ae->codeadr + iVar4;
    }
    uVar5 = ae->maxptr;
    if (iVar2 <= (int)uVar5) {
      return;
    }
    pcVar3 = GetCurrentFile(ae);
    uVar1 = ae->wl[ae->idx].l;
    pcVar6 = "[%s:%d] NOCODE output exceed limit %d\n";
    goto LAB_00117aec;
  }
  local_48.t = 0;
  local_48.l = iw;
  local_48._16_8_ = (ulong)(uint)ae->outputadr << 0x20;
  local_28 = ae->activebank;
  local_24 = ae->io + -1;
  local_2c = ae->lz;
  psVar7 = ae->wl;
  local_30 = zetype;
  if (psVar7[iw].e == 0) {
    iVar2 = 0;
    if (zetype < (E_EXPRESSION_IM|E_EXPRESSION_0V8)) {
      iVar2 = *(int *)(&DAT_00136fe4 + (ulong)zetype * 4);
    }
    ae->codeadr = ae->codeadr + iVar2;
    if (((ae->ir == 0) && (ae->iw == 0)) && (ae->imacro == 0)) {
      psVar7 = psVar7 + iw;
    }
    else {
      local_48.w = strdup(psVar7[iw].w);
      psVar7 = &local_48;
    }
    ExpressionFastTranslate(ae,&psVar7->w,1);
    ae->codeadr = ae->codeadr - iVar2;
  }
  switch(zetype) {
  case E_EXPRESSION_J8:
  case E_EXPRESSION_V8:
  case E_EXPRESSION_IM:
    iVar4 = ae->codeadr;
    local_48.e = iVar4 + -1;
    goto LAB_00117a70;
  case E_EXPRESSION_0V8:
  case E_EXPRESSION_RST:
    local_48.e = ae->codeadr;
    iVar2 = ae->outputadr + 1;
    ae->outputadr = iVar2;
    iVar4 = ae->codeadr + 1;
    break;
  case E_EXPRESSION_V16:
    iVar4 = ae->codeadr;
    local_48.e = iVar4 + -1;
    goto LAB_00117a05;
  case E_EXPRESSION_0V16:
    local_48.e = ae->codeadr;
    iVar2 = ae->outputadr + 2;
    ae->outputadr = iVar2;
    iVar4 = ae->codeadr + 2;
    break;
  case E_EXPRESSION_0V32:
    local_48.e = ae->codeadr;
    iVar2 = ae->outputadr + 4;
    ae->outputadr = iVar2;
    iVar4 = ae->codeadr + 4;
    break;
  case E_EXPRESSION_0VR:
    local_48.e = ae->codeadr;
    iVar2 = ae->outputadr + 5;
    ae->outputadr = iVar2;
    iVar4 = ae->codeadr + 5;
    break;
  case E_EXPRESSION_IV8:
  case E_EXPRESSION_IV81:
    iVar4 = ae->codeadr;
    local_48.e = iVar4 + -2;
    goto LAB_00117a70;
  case E_EXPRESSION_3V8:
    iVar4 = ae->codeadr;
    local_48.e = iVar4 + -3;
LAB_00117a70:
    iVar2 = ae->outputadr + 1;
    ae->outputadr = iVar2;
    iVar4 = iVar4 + 1;
LAB_00117a84:
    ae->codeadr = iVar4;
    goto LAB_00117a8a;
  case E_EXPRESSION_IV16:
    iVar4 = ae->codeadr;
    local_48.e = iVar4 + -2;
LAB_00117a05:
    iVar2 = ae->outputadr + 2;
    ae->outputadr = iVar2;
    iVar4 = iVar4 + 2;
    goto LAB_00117a84;
  default:
    iVar2 = ae->outputadr;
    goto LAB_00117a8a;
  }
  ae->codeadr = iVar4;
LAB_00117a8a:
  uVar5 = ae->maxptr;
  if (iVar2 <= (int)uVar5) {
    _internal_ObjectArrayAddDynamicValueConcat
              (&ae->expression,&ae->ie,&ae->me,&local_48,0x28,in_R9D,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffb0);
    return;
  }
  pcVar3 = GetCurrentFile(ae);
  uVar1 = ae->wl[ae->idx].l;
  pcVar6 = "[%s:%d] output exceed limit %d\n";
LAB_00117aec:
  rasm_printf(ae,pcVar6,pcVar3,(ulong)uVar1,(ulong)uVar5);
  FreeAssenv(ae);
  exit(3);
}

Assistant:

void PushExpression(struct s_assenv *ae,int iw,enum e_expression zetype)
{
	#undef FUNC
	#define FUNC "PushExpression"
	
	struct s_expression curexp={0};
	int startptr=0;

	if (!ae->nocode) {
		curexp.iw=iw;
		curexp.wptr=ae->outputadr;
		curexp.zetype=zetype;
		curexp.ibank=ae->activebank;
		curexp.iorgzone=ae->io-1;
		curexp.lz=ae->lz;
		/* on traduit de suite les variables du dictionnaire pour les boucles et increments
			SAUF si c'est une affectation */
		if (!ae->wl[iw].e) {
			switch (zetype) {
				case E_EXPRESSION_J8:
				case E_EXPRESSION_V8:
				case E_EXPRESSION_V16:
				case E_EXPRESSION_IM:startptr=-1;
							break;
				case E_EXPRESSION_IV8:
				case E_EXPRESSION_IV81:
				case E_EXPRESSION_IV16:startptr=-2;
							break;
				case E_EXPRESSION_3V8:startptr=-3;
							break;
				default:break;
			}
			/* hack pourri pour g�rer le $ */
			ae->codeadr+=startptr;
			/* ok mais les labels locaux des macros? */
			if (ae->ir || ae->iw || ae->imacro) {
				curexp.reference=TxtStrDup(ae->wl[iw].w);
				ExpressionFastTranslate(ae,&curexp.reference,1);
			} else {
				ExpressionFastTranslate(ae,&ae->wl[iw].w,1);
			}
			ae->codeadr-=startptr;
		}
		/* calcul adresse de reference et post-incrementation pour sauter les data */
		switch (zetype) {
			case E_EXPRESSION_J8:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V8:curexp.ptr=ae->codeadr;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_V8:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V16:curexp.ptr=ae->codeadr;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_0V32:curexp.ptr=ae->codeadr;ae->outputadr+=4;ae->codeadr+=4;break;
			case E_EXPRESSION_0VR:curexp.ptr=ae->codeadr;ae->outputadr+=5;ae->codeadr+=5;break;
			case E_EXPRESSION_V16:curexp.ptr=ae->codeadr-1;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_IV81:curexp.ptr=ae->codeadr-2;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV8:curexp.ptr=ae->codeadr-2;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_3V8:curexp.ptr=ae->codeadr-3;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV16:curexp.ptr=ae->codeadr-2;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_RST:curexp.ptr=ae->codeadr;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IM:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
		}
		if (ae->outputadr<=ae->maxptr) {
			ObjectArrayAddDynamicValueConcat((void **)&ae->expression,&ae->ie,&ae->me,&curexp,sizeof(curexp));
		} else {
			rasm_printf(ae,"[%s:%d] output exceed limit %d\n",GetCurrentFile(ae),ae->wl[ae->idx].l,ae->maxptr);
			FreeAssenv(ae);exit(3);
		}
	} else {
		switch (zetype) {
			case E_EXPRESSION_J8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_0V32:ae->outputadr+=4;ae->codeadr+=4;break;
			case E_EXPRESSION_0VR:ae->outputadr+=5;ae->codeadr+=5;break;
			case E_EXPRESSION_V16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_IV81:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_3V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_RST:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IM:ae->outputadr++;ae->codeadr++;break;
		}
		if (ae->outputadr<=ae->maxptr) {
		} else {
			rasm_printf(ae,"[%s:%d] NOCODE output exceed limit %d\n",GetCurrentFile(ae),ae->wl[ae->idx].l,ae->maxptr);
			FreeAssenv(ae);exit(3);
		}
	}
}